

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GPUShaderFP64Test10::compare
          (GPUShaderFP64Test10 *this,_variable_type type,GLvoid *left,GLvoid *right)

{
  bool bVar1;
  uint uVar2;
  _variable_type _Var3;
  TestError *this_00;
  long lVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  
  uVar2 = Utils::getNumberOfComponentsForVariableType(type);
  _Var3 = Utils::getBaseVariableType(type);
  if (_Var3 == VARIABLE_TYPE_DOUBLE) {
    bVar1 = true;
    lVar4 = 0;
    do {
      dVar6 = *(double *)((long)left + lVar4 * 8);
      dVar7 = *(double *)((long)right + lVar4 * 8);
      if (((dVar6 == dVar7) && (!NAN(dVar6) && !NAN(dVar7))) || (NAN(dVar7) || NAN(dVar6))) {
LAB_00955cd4:
        bVar5 = false;
      }
      else {
        dVar6 = dVar6 - dVar7;
        dVar7 = -dVar6;
        if (-dVar6 <= dVar6) {
          dVar7 = dVar6;
        }
        if (dVar7 <= 2e-05) goto LAB_00955cd4;
        bVar1 = false;
        bVar5 = true;
      }
    } while ((!bVar5) && (bVar5 = (ulong)uVar2 - 1 != lVar4, lVar4 = lVar4 + 1, bVar5));
  }
  else if (_Var3 == VARIABLE_TYPE_INT) {
    bVar1 = true;
    lVar4 = 0;
    do {
      if (*(int *)((long)left + lVar4 * 4) != *(int *)((long)right + lVar4 * 4)) {
        return false;
      }
      bVar5 = (ulong)uVar2 - 1 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar5);
  }
  else {
    if (_Var3 != VARIABLE_TYPE_UINT) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x353d);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    bVar1 = true;
    lVar4 = 0;
    do {
      if (*(int *)((long)left + lVar4 * 4) != *(int *)((long)right + lVar4 * 4)) {
        return false;
      }
      bVar5 = (ulong)uVar2 - 1 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar5);
  }
  return bVar1;
}

Assistant:

bool GPUShaderFP64Test10::compare(Utils::_variable_type type, const glw::GLvoid* left, const glw::GLvoid* right)
{
	bool result = true;

	const glw::GLuint			n_components = Utils::getNumberOfComponentsForVariableType(type);
	const Utils::_variable_type base_type	= Utils::getBaseVariableType(type);

	switch (base_type)
	{
	case Utils::VARIABLE_TYPE_DOUBLE:

	{
		const glw::GLdouble* left_values  = (glw::GLdouble*)left;
		const glw::GLdouble* right_values = (glw::GLdouble*)right;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLdouble left_value  = left_values[component];
			const glw::GLdouble right_value = right_values[component];

			if ((left_value != right_value) && (m_epsilon < de::abs(left_value - right_value)) &&
				(0 == Math::isnan_impl(left_value)) && (0 == Math::isnan_impl(right_value)))
			{
				result = false;
				break;
			}
		}
	}

	break;

	case Utils::VARIABLE_TYPE_INT:

	{
		const glw::GLint* left_values  = (glw::GLint*)left;
		const glw::GLint* right_values = (glw::GLint*)right;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLint left_value  = left_values[component];
			const glw::GLint right_value = right_values[component];

			if (left_value != right_value)
			{
				result = false;
				break;
			}
		}
	}

	break;

	case Utils::VARIABLE_TYPE_UINT:

	{
		const glw::GLuint* left_values  = (glw::GLuint*)left;
		const glw::GLuint* right_values = (glw::GLuint*)right;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLuint left_value  = left_values[component];
			const glw::GLuint right_value = right_values[component];

			if (left_value != right_value)
			{
				result = false;
				break;
			}
		}
	}

	break;

	default:

		TCU_FAIL("Not implemented");

		break;
	}

	return result;
}